

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_CheckOneofMessageFieldIsCleared_Test::TestBody
          (Proto3ArenaTest_CheckOneofMessageFieldIsCleared_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  AssertHelper local_198;
  Message local_190;
  int local_188;
  int32_t local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  int local_15c;
  exception *gtest_exception;
  Message local_128;
  int local_120;
  int32_t local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_e0;
  DeathTest *gtest_dt;
  TestAllTypes_NestedMessage *child;
  TestAllTypes *local_c0;
  TestAllTypes *msg;
  Arena arena;
  Proto3ArenaTest_CheckOneofMessageFieldIsCleared_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&msg);
  local_c0 = Arena::Create<proto3_arena_unittest::TestAllTypes>((Arena *)&msg);
  gtest_dt = (DeathTest *)
             proto3_arena_unittest::TestAllTypes::mutable_oneof_nested_message(local_c0);
  proto3_arena_unittest::TestAllTypes_NestedMessage::set_bb
            ((TestAllTypes_NestedMessage *)gtest_dt,100);
  proto3_arena_unittest::TestAllTypes::Clear(local_c0);
  bVar1 = internal::HasMemoryPoisoning();
  if (!bVar1) {
    local_184 = proto3_arena_unittest::TestAllTypes_NestedMessage::bb
                          ((TestAllTypes_NestedMessage *)gtest_dt);
    local_188 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_180,"child->bb()","0",&local_184,&local_188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
                 ,0x127,pcVar4);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    goto LAB_00c2efdc;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"use-after-poison",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"child->bb()\", \"100\", child->bb(), 100))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc\", 292, gtest_ar.failure_message()) = ::testing::Message()"
                       ,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
                       ,0x124,&local_e0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_e0 == (pointer)0x0) goto LAB_00c2efdc;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_e0);
      iVar2 = (*local_e0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_e0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_e0->_vptr_DeathTest[4])(local_e0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00c2ed92;
        local_15c = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_ar.message_,local_e0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_11c = proto3_arena_unittest::TestAllTypes_NestedMessage::bb
                                  ((TestAllTypes_NestedMessage *)gtest_dt);
            local_120 = 100;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_118,"child->bb()","100",&local_11c,&local_120);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
            if (!bVar1) {
              testing::Message::Message(&local_128);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_exception,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
                         ,0x124,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_exception,&local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_exception);
              testing::Message::~Message(&local_128);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
          }
          (*local_e0->_vptr_DeathTest[5])(local_e0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_ar.message_);
        }
LAB_00c2ed92:
        local_15c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_15c == 0) goto LAB_00c2efdc;
    }
  }
  testing::Message::Message(&local_168);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
             ,0x124,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
  testing::Message::~Message(&local_168);
LAB_00c2efdc:
  Arena::~Arena((Arena *)&msg);
  return;
}

Assistant:

TEST(Proto3ArenaTest, CheckOneofMessageFieldIsCleared) {
  if (!internal::DebugHardenClearOneofMessageOnArena()) {
    GTEST_SKIP() << "arena allocated oneof message fields are not hardened.";
  }

  Arena arena;
  auto msg = Arena::Create<TestAllTypes>(&arena);

  // Referring to a saved pointer to a child message is never guaranteed to
  // work. IOW, protobufs do not guarantee pointer stability. This test only
  // does this to replicate (unsupported) user behaviors.
  auto child = msg->mutable_oneof_nested_message();
  child->set_bb(100);
  msg->Clear();

  if (internal::HasMemoryPoisoning()) {
#if GTEST_HAS_DEATH_TEST
    EXPECT_DEATH(EXPECT_EQ(child->bb(), 100), "use-after-poison");
#endif  // !GTEST_HAS_DEATH_TEST
  } else {
    EXPECT_EQ(child->bb(), 0);
  }
}